

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_artifacts(void)

{
  ushort v;
  artifact_upkeep *paVar1;
  ulong uVar2;
  
  v = z_info->a_max;
  wr_u16b(v);
  for (uVar2 = 0; paVar1 = aup_info, v != uVar2; uVar2 = uVar2 + 1) {
    wr_byte(aup_info[uVar2].created);
    wr_byte(paVar1[uVar2].seen);
    wr_byte(paVar1[uVar2].everseen);
    wr_byte('\0');
  }
  return;
}

Assistant:

void wr_artifacts(void)
{
	int i;
	uint16_t tmp16u;

	/* Hack -- Dump the artifacts */
	tmp16u = z_info->a_max;
	wr_u16b(tmp16u);
	for (i = 0; i < tmp16u; i++) {
		const struct artifact_upkeep *au = &aup_info[i];
		wr_byte(au->created ? 1 : 0);
		wr_byte(au->seen ? 1 : 0);
		wr_byte(au->everseen ? 1 : 0);
		wr_byte(0);
	}
}